

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplerng.c
# Opt level: O0

int simplerng_poisson_large(double lambda)

{
  int iVar1;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double __x;
  double dVar4;
  double dVar5;
  int n;
  double rhs;
  double lhs;
  double temp;
  double y;
  double v;
  double x;
  double u;
  double c;
  
  if ((in_XMM0_Qa != simplerng_poisson_large::old_lambda) ||
     (NAN(in_XMM0_Qa) || NAN(simplerng_poisson_large::old_lambda))) {
    dVar3 = sqrt(in_XMM0_Qa * 3.0);
    simplerng_poisson_large::beta = 3.141592653589793 / dVar3;
    simplerng_poisson_large::alpha = simplerng_poisson_large::beta * in_XMM0_Qa;
    dVar3 = log(0.767 - 3.36 / in_XMM0_Qa);
    dVar2 = log(simplerng_poisson_large::beta);
    simplerng_poisson_large::k = (dVar3 - in_XMM0_Qa) - dVar2;
    simplerng_poisson_large::old_lambda = in_XMM0_Qa;
  }
  do {
    do {
      dVar2 = simplerng_getuniform();
      dVar3 = simplerng_poisson_large::alpha;
      dVar2 = log((1.0 - dVar2) / dVar2);
      dVar3 = (dVar3 - dVar2) / simplerng_poisson_large::beta;
      dVar2 = floor(dVar3 + 0.5);
      iVar1 = (int)dVar2;
    } while (iVar1 < 0);
    dVar2 = simplerng_getuniform();
    __x = -simplerng_poisson_large::beta * dVar3 + simplerng_poisson_large::alpha;
    dVar3 = exp(__x);
    dVar2 = log(dVar2 / ((dVar3 + 1.0) * (dVar3 + 1.0)));
    dVar3 = simplerng_poisson_large::k;
    dVar4 = log(in_XMM0_Qa);
    dVar5 = simplerng_logfactorial((int)((ulong)dVar3 >> 0x20));
  } while (((double)iVar1 * dVar4 + dVar3) - dVar5 < __x + dVar2);
  return iVar1;
}

Assistant:

int simplerng_poisson_large(double lambda)
{
  /* "Rejection method PA" from "The Computer Generation of Poisson Random Variables" by A. C. Atkinson
     Journal of the Royal Statistical Society Series C (Applied Statistics) Vol. 28, No. 1. (1979)
     The article is on pages 29-35. The algorithm given here is on page 32. */
  static double beta, alpha, k;
  static double old_lambda = -999999.;

  if (lambda != old_lambda) {
    double c = 0.767 - 3.36/lambda;
    beta = PI/sqrt(3.0*lambda);
    alpha = beta*lambda;
    k = log(c) - lambda - log(beta);
    old_lambda = lambda;
  }

  for(;;) { /* forever */
    double u, x, v, y, temp, lhs, rhs;
    int n;

    u = simplerng_getuniform();
    x = (alpha - log((1.0 - u)/u))/beta;
    n = (int) floor(x + 0.5);
    if (n < 0) continue;

    v = simplerng_getuniform();
    y = alpha - beta*x;
    temp = 1.0 + exp(y);
    lhs = y + log(v/(temp*temp));
    rhs = k + n*log(lambda) - simplerng_logfactorial(n);
    if (lhs <= rhs) return n;
  }

}